

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O0

void __thiscall QOpenGLFramebufferObject::~QOpenGLFramebufferObject(QOpenGLFramebufferObject *this)

{
  void *in_RDI;
  QOpenGLFramebufferObject *in_stack_00000020;
  
  ~QOpenGLFramebufferObject(in_stack_00000020);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

QOpenGLFramebufferObject::~QOpenGLFramebufferObject()
{
    Q_D(QOpenGLFramebufferObject);
    if (isBound())
        release();

    for (const auto &color : std::as_const(d->colorAttachments)) {
        if (color.guard)
            color.guard->free();
    }
    d->colorAttachments.clear();

    if (d->depth_buffer_guard)
        d->depth_buffer_guard->free();
    if (d->stencil_buffer_guard && d->stencil_buffer_guard != d->depth_buffer_guard)
        d->stencil_buffer_guard->free();
    if (d->fbo_guard)
        d->fbo_guard->free();

    QOpenGLContextPrivate *contextPrv = QOpenGLContextPrivate::get(QOpenGLContext::currentContext());
    if (contextPrv && contextPrv->qgl_current_fbo == this) {
        contextPrv->qgl_current_fbo_invalid = true;
        contextPrv->qgl_current_fbo = nullptr;
    }
}